

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O2

void __thiscall TCLAP::StdOutput::_shortUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  Arg *pAVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer ppAVar5;
  _List_node_base *p_Var6;
  ulong uVar7;
  allocator<char> local_131;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  string s;
  XorHandler xorHandler;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  string progName;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xb])(_cmd);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            (&argList,(list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
                      CONCAT44(extraout_var,iVar4));
  iVar4 = (*_cmd->_vptr_CmdLineInterface[10])(_cmd);
  std::__cxx11::string::string((string *)&progName,(string *)CONCAT44(extraout_var_00,iVar4));
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xc])(_cmd);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&xorHandler._orList,
           (vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)CONCAT44(extraout_var_01,iVar4));
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&xorList,&xorHandler._orList);
  std::operator+(&s,&progName," ");
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)xorList.
                             super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)xorList.
                            super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1) {
    std::__cxx11::string::append((char *)&s);
    for (ppAVar5 = xorList.
                   super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7].
                   super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar5 !=
        xorList.
        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar7].
        super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppAVar5 = ppAVar5 + 1) {
      pAVar1 = *ppAVar5;
      std::__cxx11::string::string<std::allocator<char>>(local_90,"val",&local_131);
      (*pAVar1->_vptr_Arg[8])(&local_70,pAVar1,local_90);
      std::operator+(&local_50,&local_70,"|");
      std::__cxx11::string::append((string *)&s);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string(local_90);
    }
    s._M_dataplus._M_p[s._M_string_length - 1] = '}';
  }
  p_Var6 = (_List_node_base *)&argList;
  while (p_Var6 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)&p_Var6->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)&argList) {
    bVar3 = XorHandler::contains(&xorHandler,(Arg *)p_Var6[1]._M_next);
    if (!bVar3) {
      plVar2 = (long *)p_Var6[1]._M_next;
      std::__cxx11::string::string<std::allocator<char>>(local_90,"val",&local_131);
      (**(code **)(*plVar2 + 0x40))(&local_70,plVar2,local_90);
      std::operator+(&local_50," ",&local_70);
      std::__cxx11::string::append((string *)&s);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string(local_90);
    }
  }
  iVar4 = 0x23;
  if ((int)progName._M_string_length < 0x23) {
    iVar4 = (int)progName._M_string_length;
  }
  spacePrint(this,os,&s,0x4b,3,iVar4 + 2);
  std::__cxx11::string::~string((string *)&s);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&xorList);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&xorHandler._orList);
  std::__cxx11::string::~string((string *)&progName);
  std::__cxx11::_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::_M_clear
            (&argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>);
  return;
}

Assistant:

inline void 
StdOutput::_shortUsage( CmdLineInterface& _cmd, 
						std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string progName = _cmd.getProgramName();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	std::string s = progName + " ";

	// first the xor
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			s += " {";
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); it++ )
				s += (*it)->shortID() + "|";

			s[s.length()-1] = '}';
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			s += " " + (*it)->shortID();

	// if the program name is too long, then adjust the second line offset 
	int secondLineOffset = static_cast<int>(progName.length()) + 2;
	if ( secondLineOffset > 75/2 )
		secondLineOffset = static_cast<int>(75/2);

	spacePrint( os, s, 75, 3, secondLineOffset );
}